

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void __thiscall FRemapTable::MakeIdentity(FRemapTable *this)

{
  int local_14;
  int i;
  FRemapTable *this_local;
  
  for (local_14 = 0; local_14 < this->NumEntries; local_14 = local_14 + 1) {
    this->Remap[local_14] = (BYTE)local_14;
  }
  for (local_14 = 0; local_14 < this->NumEntries; local_14 = local_14 + 1) {
    this->Palette[local_14].field_0 = GPalette.BaseColors[local_14].field_0;
  }
  for (local_14 = 1; local_14 < this->NumEntries; local_14 = local_14 + 1) {
    this->Palette[local_14].field_0.field_0.a = 0xff;
  }
  return;
}

Assistant:

void FRemapTable::MakeIdentity()
{
	int i;

	for (i = 0; i < NumEntries; ++i)
	{
		Remap[i] = i;
	}
	for (i = 0; i < NumEntries; ++i)
	{
		Palette[i] = GPalette.BaseColors[i];
	}
	for (i = 1; i < NumEntries; ++i)
	{
		Palette[i].a = 255;
	}
}